

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

void __thiscall
MeCab::Param::set<std::__cxx11::string>
          (Param *this,char *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool rewrite)

{
  mapped_type *this_00;
  byte in_CL;
  string *in_RDX;
  char *in_RSI;
  string key2;
  string *in_stack_ffffffffffffff28;
  bool local_c2;
  bool local_c1;
  string local_a8 [16];
  key_type *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff70;
  string local_88 [32];
  _Self local_68;
  _Self local_60 [3];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  string *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_c1 = true;
  if ((local_19 & 1) == 0) {
    local_c2 = false;
    if ((local_19 & 1) == 0) {
      local_60[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff28,(key_type *)0x13e802);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffff28);
      local_c2 = std::operator==(local_60,&local_68);
    }
    local_c1 = local_c2;
  }
  if (local_c1 != false) {
    std::__cxx11::string::string(local_a8,local_18);
    ::(anonymous_namespace)::lexical_cast<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff28);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::operator=((string *)this_00,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void set(const char* key, const T &value,
           bool rewrite = true) {
    std::string key2 = std::string(key);
    if (rewrite || (!rewrite && conf_.find(key2) == conf_.end()))
      conf_[key2] = lexical_cast<std::string, T>(value);
  }